

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  ushort uVar1;
  stbi__uint32 sVar2;
  bool bVar3;
  undefined8 uVar4;
  stbi_uc sVar5;
  byte bVar6;
  uchar uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  stbi__uint32 sVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  char *pcVar19;
  void *pvVar20;
  stbi__context *data;
  stbi__uint16 *psVar21;
  uchar *data_00;
  float *data_01;
  stbi_uc *psVar22;
  byte *pbVar23;
  uchar *puVar24;
  long lVar25;
  uint uVar26;
  uint uVar27;
  stbi__uint16 *psVar28;
  int iVar29;
  ulong uVar30;
  ulong uVar31;
  undefined4 in_register_00000084;
  stbi_uc *two_back;
  stbi__result_info *ri_00;
  ulong uVar32;
  int iVar33;
  long in_FS_OFFSET;
  bool bVar34;
  bool bVar35;
  float fVar36;
  float fVar37;
  stbi_uc pal [256] [4];
  uint local_8960;
  stbi__uint16 *local_8958;
  uint local_8930;
  stbi__uint16 *local_8918;
  uint local_88ec;
  stbi__bmp_data local_88cc;
  stbi__gif local_88a8;
  
  two_back = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->channel_order = 0;
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri_00 = ri;
  iVar8 = stbi__check_png_header(s);
  psVar22 = s->img_buffer_original;
  s->img_buffer = psVar22;
  s->img_buffer_end = s->img_buffer_original_end;
  if (iVar8 != 0) {
    if ((uint)req_comp < 5) {
      local_88a8._0_8_ = s;
      iVar8 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      psVar21 = (stbi__uint16 *)local_88a8.history;
      uVar4 = local_88a8._0_8_;
      psVar28 = (stbi__uint16 *)0x0;
      if (iVar8 != 0) {
        iVar8 = 8;
        if ((8 < local_88a8.flags) && (iVar8 = 0x10, local_88a8.flags != 0x10)) {
          pcVar19 = "bad bits_per_channel";
          goto LAB_0010f3f6;
        }
        ri->bits_per_channel = iVar8;
        local_88a8.history = (stbi_uc *)0x0;
        if ((req_comp != 0) && (iVar8 = *(int *)(local_88a8._0_8_ + 0xc), iVar8 != req_comp)) {
          if (local_88a8.flags < 9) {
            psVar21 = (stbi__uint16 *)
                      stbi__convert_format
                                ((uchar *)psVar21,iVar8,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          else {
            psVar21 = stbi__convert_format16
                                (psVar21,iVar8,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                                 *(stbi__uint32 *)(local_88a8._0_8_ + 4));
          }
          *(int *)(uVar4 + 0xc) = req_comp;
          if (psVar21 == (stbi__uint16 *)0x0) {
            return (void *)0x0;
          }
        }
        *x = *(stbi__uint32 *)local_88a8._0_8_;
        *y = *(stbi__uint32 *)(local_88a8._0_8_ + 4);
        psVar28 = psVar21;
        if (comp != (int *)0x0) {
          *comp = *(int *)(local_88a8._0_8_ + 8);
        }
      }
      free(local_88a8.history);
      local_88a8.history = (stbi_uc *)0x0;
      free(local_88a8.background);
      local_88a8.background = (stbi_uc *)0x0;
      free(local_88a8.out);
      return psVar28;
    }
    pcVar19 = "bad req_comp";
    goto LAB_0010f3f6;
  }
  if (psVar22 < s->img_buffer_original_end) {
LAB_0010f431:
    s->img_buffer = psVar22 + 1;
    if (*psVar22 != 'B') goto LAB_0010f5b6;
    psVar22 = s->img_buffer;
    if (s->img_buffer_end <= psVar22) {
      if (s->read_from_callbacks == 0) goto LAB_0010f5b6;
      stbi__refill_buffer(s);
      psVar22 = s->img_buffer;
    }
    s->img_buffer = psVar22 + 1;
    if (*psVar22 != 'M') goto LAB_0010f5b6;
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    stbi__get16le(s);
    uVar9 = stbi__get16le(s);
    iVar8 = stbi__get16le(s);
    uVar9 = iVar8 << 0x10 | uVar9;
    if ((((0x38 < uVar9) || ((0x100010000001000U >> ((ulong)uVar9 & 0x3f) & 1) == 0)) &&
        (uVar9 != 0x7c)) && (uVar9 != 0x6c)) goto LAB_0010f5b6;
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    local_88cc.all_a = 0xff;
    pvVar20 = stbi__bmp_parse_header(s,&local_88cc);
    if (pvVar20 == (void *)0x0) {
      return (void *)0x0;
    }
    uVar9 = s->img_y;
    uVar13 = -uVar9;
    if (0 < (int)uVar9) {
      uVar13 = uVar9;
    }
    s->img_y = uVar13;
    if ((uVar13 < 0x1000001) && (uVar26 = s->img_x, uVar26 < 0x1000001)) {
      if (local_88cc.hsz == 0xc) {
        if (local_88cc.bpp < 0x18) {
          uVar31 = (ulong)(uint)(((local_88cc.offset - local_88cc.extra_read) + -0x18) / 3);
        }
        else {
LAB_0010fa64:
          uVar31 = 0;
        }
      }
      else {
        if (0xf < local_88cc.bpp) goto LAB_0010fa64;
        uVar31 = (ulong)(uint)(local_88cc.offset - (local_88cc.extra_read + local_88cc.hsz) >> 2);
      }
      local_8918._0_4_ = local_88cc.all_a;
      iVar8 = (int)uVar31;
      if ((iVar8 == 0) &&
         (s->img_buffer + ((long)s->callback_already_read - (long)s->img_buffer_original) !=
          (stbi_uc *)(long)local_88cc.offset)) {
        pcVar19 = "bad offset";
        goto LAB_0010f3f6;
      }
      uVar27 = local_88cc.ma ^ 0xff000000;
      s->img_n = 4 - (uint)(local_88cc.ma == 0 || local_88cc.bpp == 0x18 && uVar27 == 0);
      iVar10 = req_comp;
      if (req_comp < 3) {
        iVar10 = s->img_n;
      }
      iVar12 = stbi__mad3sizes_valid(iVar10,uVar26,uVar13,0);
      if (iVar12 == 0) goto LAB_0011000e;
      data_00 = (uchar *)stbi__malloc_mad3(iVar10,uVar26,uVar13,0);
      if (data_00 != (uchar *)0x0) {
        if (local_88cc.bpp < 0x10) {
          if (iVar8 < 0x101 && iVar8 != 0) {
            if (0 < iVar8) {
              uVar30 = 0;
              do {
                psVar22 = s->img_buffer;
                if (psVar22 < s->img_buffer_end) {
LAB_0010fcb1:
                  s->img_buffer = psVar22 + 1;
                  sVar5 = *psVar22;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar22 = s->img_buffer;
                    goto LAB_0010fcb1;
                  }
                  sVar5 = '\0';
                }
                local_88a8.pal[uVar30 - 0xd][2] = sVar5;
                psVar22 = s->img_buffer;
                if (psVar22 < s->img_buffer_end) {
LAB_0010fcf4:
                  s->img_buffer = psVar22 + 1;
                  sVar5 = *psVar22;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar22 = s->img_buffer;
                    goto LAB_0010fcf4;
                  }
                  sVar5 = '\0';
                }
                local_88a8.pal[uVar30 - 0xd][1] = sVar5;
                psVar22 = s->img_buffer;
                if (psVar22 < s->img_buffer_end) {
LAB_0010fd37:
                  s->img_buffer = psVar22 + 1;
                  sVar5 = *psVar22;
                }
                else {
                  if (s->read_from_callbacks != 0) {
                    stbi__refill_buffer(s);
                    psVar22 = s->img_buffer;
                    goto LAB_0010fd37;
                  }
                  sVar5 = '\0';
                }
                local_88a8.pal[uVar30 - 0xd][0] = sVar5;
                if (local_88cc.hsz != 0xc) {
                  psVar22 = s->img_buffer;
                  if (s->img_buffer_end <= psVar22) {
                    if (s->read_from_callbacks == 0) goto LAB_0010fd87;
                    stbi__refill_buffer(s);
                    psVar22 = s->img_buffer;
                  }
                  s->img_buffer = psVar22 + 1;
                }
LAB_0010fd87:
                local_88a8.pal[uVar30 - 0xd][3] = 0xff;
                uVar30 = uVar30 + 1;
              } while (uVar31 != uVar30);
            }
            stbi__skip(s,(iVar8 * (local_88cc.hsz == 0xc | 0xfffffffc) + local_88cc.offset) -
                         (local_88cc.hsz + local_88cc.extra_read));
            if (local_88cc.bpp == 8) {
              uVar13 = s->img_x;
            }
            else if (local_88cc.bpp == 4) {
              uVar13 = s->img_x + 1 >> 1;
            }
            else {
              if (local_88cc.bpp != 1) {
                free(data_00);
                pcVar19 = "bad bpp";
                goto LAB_0010f3f6;
              }
              uVar13 = s->img_x + 7 >> 3;
            }
            local_8930 = -uVar13 & 3;
            if (local_88cc.bpp == 1) {
              if (0 < (int)s->img_y) {
                iVar8 = 0;
                iVar12 = 0;
                do {
                  pbVar23 = s->img_buffer;
                  if (pbVar23 < s->img_buffer_end) {
LAB_00110088:
                    s->img_buffer = pbVar23 + 1;
                    uVar13 = (uint)*pbVar23;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      pbVar23 = s->img_buffer;
                      goto LAB_00110088;
                    }
                    uVar13 = 0;
                  }
                  uVar26 = 7;
                  sVar11 = 1;
                  do {
                    sVar2 = s->img_x;
                    if ((int)sVar2 <= (int)(sVar11 - 1)) break;
                    uVar31 = (ulong)((uVar13 >> (uVar26 & 0x1f) & 1) != 0);
                    data_00[iVar8] = local_88a8.pal[uVar31 - 0xd][0];
                    data_00[(long)iVar8 + 1] = local_88a8.pal[uVar31 - 0xd][1];
                    data_00[(long)iVar8 + 2] = local_88a8.pal[uVar31 - 0xd][2];
                    iVar15 = iVar8 + 3;
                    if (iVar10 == 4) {
                      data_00[(long)iVar8 + 3] = 0xff;
                      iVar15 = iVar8 + 4;
                    }
                    iVar8 = iVar15;
                    if (sVar11 != sVar2) {
                      if ((int)uVar26 < 1) {
                        pbVar23 = s->img_buffer;
                        if (pbVar23 < s->img_buffer_end) {
LAB_00110139:
                          s->img_buffer = pbVar23 + 1;
                          uVar13 = (uint)*pbVar23;
                        }
                        else {
                          if (s->read_from_callbacks != 0) {
                            stbi__refill_buffer(s);
                            pbVar23 = s->img_buffer;
                            goto LAB_00110139;
                          }
                          uVar13 = 0;
                        }
                        uVar26 = 7;
                      }
                      else {
                        uVar26 = uVar26 - 1;
                      }
                    }
                    bVar35 = sVar11 != sVar2;
                    sVar11 = sVar11 + 1;
                  } while (bVar35);
                  stbi__skip(s,local_8930);
                  iVar12 = iVar12 + 1;
                } while (iVar12 < (int)s->img_y);
              }
            }
            else if (0 < (int)s->img_y) {
              uVar31 = 0;
              iVar8 = 0;
              do {
                if (0 < (int)s->img_x) {
                  iVar12 = 0;
                  do {
                    pbVar23 = s->img_buffer;
                    if (pbVar23 < s->img_buffer_end) {
LAB_001101f1:
                      s->img_buffer = pbVar23 + 1;
                      uVar13 = (uint)*pbVar23;
                    }
                    else {
                      if (s->read_from_callbacks != 0) {
                        stbi__refill_buffer(s);
                        pbVar23 = s->img_buffer;
                        goto LAB_001101f1;
                      }
                      uVar13 = 0;
                    }
                    uVar26 = uVar13 >> 4;
                    if (local_88cc.bpp != 4) {
                      uVar26 = uVar13;
                    }
                    uVar30 = (ulong)uVar26;
                    uVar13 = uVar13 & 0xf;
                    if (local_88cc.bpp != 4) {
                      uVar13 = 0;
                    }
                    lVar25 = (long)(int)uVar31;
                    uVar32 = lVar25 + 3;
                    data_00[lVar25] = local_88a8.pal[uVar30 - 0xd][0];
                    data_00[lVar25 + 1] = local_88a8.pal[uVar30 - 0xd][1];
                    data_00[lVar25 + 2] = local_88a8.pal[uVar30 - 0xd][2];
                    if (iVar10 == 4) {
                      data_00[lVar25 + 3] = 0xff;
                      uVar32 = (ulong)((int)uVar31 + 4);
                    }
                    sVar11 = s->img_x;
                    if (iVar12 + 1U == sVar11) {
LAB_001102ef:
                      uVar31 = uVar32 & 0xffffffff;
                    }
                    else {
                      if (local_88cc.bpp == 8) {
                        pbVar23 = s->img_buffer;
                        if (s->img_buffer_end <= pbVar23) {
                          if (s->read_from_callbacks == 0) {
                            uVar13 = 0;
                            goto LAB_001102b2;
                          }
                          stbi__refill_buffer(s);
                          pbVar23 = s->img_buffer;
                        }
                        s->img_buffer = pbVar23 + 1;
                        uVar13 = (uint)*pbVar23;
                      }
LAB_001102b2:
                      lVar25 = (long)(int)uVar32;
                      uVar31 = lVar25 + 3;
                      uVar30 = (ulong)uVar13;
                      data_00[lVar25] = local_88a8.pal[uVar30 - 0xd][0];
                      data_00[lVar25 + 1] = local_88a8.pal[uVar30 - 0xd][1];
                      data_00[lVar25 + 2] = local_88a8.pal[uVar30 - 0xd][2];
                      if (iVar10 == 4) {
                        uVar32 = (ulong)((int)uVar32 + 4);
                        data_00[lVar25 + 3] = 0xff;
                        goto LAB_001102ef;
                      }
                    }
                  } while ((iVar12 + 1U != sVar11) && (iVar12 = iVar12 + 2, iVar12 < (int)s->img_x))
                  ;
                }
                stbi__skip(s,local_8930);
                iVar8 = iVar8 + 1;
              } while (iVar8 < (int)s->img_y);
            }
            goto LAB_00110617;
          }
          free(data_00);
          pcVar19 = "invalid";
          goto LAB_0010f3f6;
        }
        stbi__skip(s,local_88cc.offset - (local_88cc.hsz + local_88cc.extra_read));
        if (local_88cc.bpp == 0x18) {
          iVar8 = -3;
LAB_0010fe42:
          uVar13 = iVar8 * s->img_x & 3;
        }
        else {
          uVar13 = 0;
          if (local_88cc.bpp == 0x10) {
            iVar8 = -2;
            goto LAB_0010fe42;
          }
        }
        if (local_88cc.bpp == 0x18) {
          bVar35 = false;
LAB_0010fe88:
          bVar34 = false;
        }
        else {
          if (local_88cc.bpp != 0x20) {
            bVar35 = true;
            goto LAB_0010fe88;
          }
          bVar34 = (local_88cc.mr == 0xff0000 && (local_88cc.mg == 0xff00 && local_88cc.mb == 0xff))
                   && uVar27 == 0;
          bVar35 = (local_88cc.mr != 0xff0000 || (local_88cc.mg != 0xff00 || local_88cc.mb != 0xff))
                   || uVar27 != 0;
        }
        iVar14 = 0;
        iVar8 = 0;
        iVar12 = 0;
        iVar15 = 0;
        local_8960 = 0;
        uVar26 = 0;
        uVar27 = 0;
        local_88ec = 0;
        if (bVar35) {
          if (local_88cc.mb != 0 && (local_88cc.mg != 0 && local_88cc.mr != 0)) {
            iVar14 = stbi__high_bit(local_88cc.mr);
            local_8960 = stbi__bitcount(local_88cc.mr);
            iVar8 = stbi__high_bit(local_88cc.mg);
            uVar26 = stbi__bitcount(local_88cc.mg);
            iVar12 = stbi__high_bit(local_88cc.mb);
            uVar27 = stbi__bitcount(local_88cc.mb);
            iVar15 = stbi__high_bit(local_88cc.ma);
            local_88ec = stbi__bitcount(local_88cc.ma);
            if ((local_88ec < 9 && uVar27 < 9) && (uVar26 < 9 && local_8960 < 9)) {
              iVar14 = iVar14 + -7;
              iVar8 = iVar8 + -7;
              iVar12 = iVar12 + -7;
              iVar15 = iVar15 + -7;
              goto LAB_0011036c;
            }
          }
          free(data_00);
          *(char **)(in_FS_OFFSET + -0x20) = "bad masks";
          bVar3 = false;
        }
        else {
LAB_0011036c:
          bVar3 = true;
          if (0 < (int)s->img_y) {
            iVar29 = 0;
            iVar16 = 0;
            do {
              if (bVar35) {
                if (0 < (int)s->img_x) {
                  iVar33 = 0;
                  do {
                    uVar17 = stbi__get16le(s);
                    if (local_88cc.bpp != 0x10) {
                      iVar18 = stbi__get16le(s);
                      uVar17 = uVar17 | iVar18 << 0x10;
                    }
                    iVar18 = stbi__shiftsigned(uVar17 & local_88cc.mr,iVar14,local_8960);
                    data_00[iVar29] = (uchar)iVar18;
                    iVar18 = stbi__shiftsigned(uVar17 & local_88cc.mg,iVar8,uVar26);
                    data_00[(long)iVar29 + 1] = (uchar)iVar18;
                    iVar18 = stbi__shiftsigned(uVar17 & local_88cc.mb,iVar12,uVar27);
                    data_00[(long)iVar29 + 2] = (uchar)iVar18;
                    if (local_88cc.ma == 0) {
                      uVar17 = 0xff;
                    }
                    else {
                      uVar17 = stbi__shiftsigned(uVar17 & local_88cc.ma,iVar15,local_88ec);
                    }
                    iVar18 = iVar29 + 3;
                    if (iVar10 == 4) {
                      data_00[(long)iVar29 + 3] = (uchar)uVar17;
                      iVar18 = iVar29 + 4;
                    }
                    iVar29 = iVar18;
                    local_8918._0_4_ = (uint)local_8918 | uVar17;
                    iVar33 = iVar33 + 1;
                  } while (iVar33 < (int)s->img_x);
                }
              }
              else if (0 < (int)s->img_x) {
                iVar33 = 0;
                do {
                  puVar24 = s->img_buffer;
                  if (puVar24 < s->img_buffer_end) {
LAB_001104af:
                    s->img_buffer = puVar24 + 1;
                    uVar7 = *puVar24;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar24 = s->img_buffer;
                      goto LAB_001104af;
                    }
                    uVar7 = '\0';
                  }
                  data_00[(long)iVar29 + 2] = uVar7;
                  puVar24 = s->img_buffer;
                  if (puVar24 < s->img_buffer_end) {
LAB_001104f7:
                    s->img_buffer = puVar24 + 1;
                    uVar7 = *puVar24;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar24 = s->img_buffer;
                      goto LAB_001104f7;
                    }
                    uVar7 = '\0';
                  }
                  data_00[(long)iVar29 + 1] = uVar7;
                  puVar24 = s->img_buffer;
                  if (puVar24 < s->img_buffer_end) {
LAB_0011053c:
                    s->img_buffer = puVar24 + 1;
                    uVar7 = *puVar24;
                  }
                  else {
                    if (s->read_from_callbacks != 0) {
                      stbi__refill_buffer(s);
                      puVar24 = s->img_buffer;
                      goto LAB_0011053c;
                    }
                    uVar7 = '\0';
                  }
                  data_00[iVar29] = uVar7;
                  bVar6 = 0xff;
                  if (bVar34) {
                    pbVar23 = s->img_buffer;
                    if (s->img_buffer_end <= pbVar23) {
                      if (s->read_from_callbacks == 0) {
                        bVar6 = 0;
                        goto LAB_00110594;
                      }
                      stbi__refill_buffer(s);
                      pbVar23 = s->img_buffer;
                    }
                    s->img_buffer = pbVar23 + 1;
                    bVar6 = *pbVar23;
                  }
LAB_00110594:
                  iVar18 = iVar29 + 3;
                  if (iVar10 == 4) {
                    data_00[(long)iVar29 + 3] = bVar6;
                    iVar18 = iVar29 + 4;
                  }
                  iVar29 = iVar18;
                  local_8918._0_4_ = (uint)local_8918 | bVar6;
                  iVar33 = iVar33 + 1;
                } while (iVar33 < (int)s->img_x);
              }
              stbi__skip(s,uVar13);
              iVar16 = iVar16 + 1;
            } while (iVar16 < (int)s->img_y);
            bVar3 = true;
          }
        }
        if (!bVar3) {
          return (void *)0x0;
        }
LAB_00110617:
        if (((iVar10 == 4) && ((uint)local_8918 == 0)) &&
           (iVar8 = s->img_x * s->img_y * 4, -1 < iVar8 + -1)) {
          lVar25 = (ulong)(iVar8 - 4) + 7;
          do {
            data_00[lVar25 + -4] = 0xff;
            lVar25 = lVar25 + -4;
          } while (3 < lVar25);
        }
        if (0 < (int)uVar9) {
          uVar9 = (int)s->img_y >> 1;
          if (0 < (int)uVar9) {
            uVar26 = s->img_x * iVar10;
            uVar13 = (s->img_y - 1) * uVar26;
            uVar31 = 0;
            uVar30 = 0;
            do {
              if (0 < (int)uVar26) {
                uVar32 = 0;
                do {
                  uVar7 = data_00[uVar32 + uVar31];
                  data_00[uVar32 + uVar31] = data_00[uVar32 + uVar13];
                  data_00[uVar32 + uVar13] = uVar7;
                  uVar32 = uVar32 + 1;
                } while (uVar26 != uVar32);
              }
              uVar30 = uVar30 + 1;
              uVar13 = uVar13 - uVar26;
              uVar31 = (ulong)((int)uVar31 + uVar26);
            } while (uVar30 != uVar9);
          }
        }
        if ((iVar10 != req_comp && req_comp != 0) &&
           (data_00 = stbi__convert_format(data_00,iVar10,req_comp,s->img_x,s->img_y),
           data_00 == (uchar *)0x0)) {
          return (void *)0x0;
        }
        *x = s->img_x;
        *y = s->img_y;
        if (comp != (int *)0x0) {
          *comp = s->img_n;
          return data_00;
        }
        return data_00;
      }
LAB_0011080c:
      pcVar19 = "outofmem";
      goto LAB_0010f3f6;
    }
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      psVar22 = s->img_buffer;
      goto LAB_0010f431;
    }
LAB_0010f5b6:
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    iVar8 = stbi__gif_test(s);
    if (iVar8 != 0) {
      memset(&local_88a8,0,0x8870);
      data = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,two_back);
      if (data == s) {
        data = (stbi__context *)0x0;
      }
      if (data == (stbi__context *)0x0) {
        if (local_88a8.out != (stbi_uc *)0x0) {
          free(local_88a8.out);
        }
        data = (stbi__context *)0x0;
      }
      else {
        *x = local_88a8.w;
        *y = local_88a8.h;
        if ((req_comp & 0xfffffffbU) != 0) {
          data = (stbi__context *)
                 stbi__convert_format((uchar *)data,4,req_comp,local_88a8.w,local_88a8.h);
        }
      }
      free(local_88a8.history);
      free(local_88a8.background);
      return data;
    }
    iVar8 = stbi__get16be(s);
    uVar9 = stbi__get16be(s);
    s->img_buffer = s->img_buffer_original;
    s->img_buffer_end = s->img_buffer_original_end;
    if ((uVar9 | iVar8 << 0x10) != 0x38425053) {
      iVar8 = stbi__pic_test(s);
      if (iVar8 != 0) {
        pvVar20 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
        return pvVar20;
      }
      iVar8 = stbi__jpeg_test(s);
      if (iVar8 != 0) {
        pvVar20 = stbi__jpeg_load(s,x,y,comp,req_comp,ri_00);
        return pvVar20;
      }
      iVar8 = stbi__pnm_test(s);
      if (iVar8 != 0) {
        pvVar20 = stbi__pnm_load(s,x,y,comp,req_comp,ri);
        return pvVar20;
      }
      iVar8 = stbi__hdr_test(s);
      if (iVar8 != 0) {
        data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
        if (req_comp == 0) {
          req_comp = *comp;
        }
        psVar22 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
        return psVar22;
      }
      iVar8 = stbi__tga_test(s);
      if (iVar8 != 0) {
        pvVar20 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
        return pvVar20;
      }
      pcVar19 = "unknown image type";
      goto LAB_0010f3f6;
    }
    iVar8 = stbi__get16be(s);
    uVar9 = stbi__get16be(s);
    if ((uVar9 | iVar8 << 0x10) != 0x38425053) {
      pcVar19 = "not PSD";
      goto LAB_0010f3f6;
    }
    iVar8 = stbi__get16be(s);
    if (iVar8 != 1) {
      pcVar19 = "wrong version";
      goto LAB_0010f3f6;
    }
    if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0010f8f5:
      s->img_buffer = s->img_buffer + 6;
    }
    else {
      iVar8 = (int)s->img_buffer_end - *(int *)&s->img_buffer;
      if (5 < iVar8) goto LAB_0010f8f5;
      s->img_buffer = s->img_buffer_end;
      (*(s->io).skip)(s->io_user_data,6 - iVar8);
    }
    uVar9 = stbi__get16be(s);
    if (0x10 < uVar9) {
      pcVar19 = "wrong channel count";
      goto LAB_0010f3f6;
    }
    iVar8 = stbi__get16be(s);
    iVar8 = iVar8 * 0x10000;
    iVar10 = stbi__get16be(s);
    uVar13 = iVar10 + iVar8;
    iVar12 = stbi__get16be(s);
    iVar15 = stbi__get16be(s);
    if ((int)uVar13 < 0x1000001) {
      iVar12 = iVar12 * 0x10000;
      uVar26 = iVar15 + iVar12;
      if ((int)uVar26 < 0x1000001) {
        iVar14 = stbi__get16be(s);
        if ((iVar14 != 8) && (iVar14 != 0x10)) {
          pcVar19 = "unsupported bit depth";
          goto LAB_0010f3f6;
        }
        iVar16 = stbi__get16be(s);
        if (iVar16 != 3) {
          pcVar19 = "wrong color format";
          goto LAB_0010f3f6;
        }
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        sVar11 = stbi__get32be(s);
        stbi__skip(s,sVar11);
        uVar27 = stbi__get16be(s);
        if (1 < uVar27) {
          pcVar19 = "bad compression";
          goto LAB_0010f3f6;
        }
        iVar16 = stbi__mad3sizes_valid(4,uVar26,uVar13,0);
        if (iVar16 != 0) {
          if (((bpc == 0x10) && (iVar14 == 0x10)) && (uVar27 == 0)) {
            psVar21 = (stbi__uint16 *)stbi__malloc_mad3(8,uVar26,uVar13,0);
            ri->bits_per_channel = 0x10;
          }
          else {
            psVar21 = (stbi__uint16 *)malloc((long)(int)(uVar13 * uVar26 * 4));
          }
          if (psVar21 != (stbi__uint16 *)0x0) {
            iVar16 = uVar26 * uVar13;
            if (uVar27 == 0) {
              iVar29 = (iVar10 + iVar8) * (iVar15 + iVar12);
              uVar31 = 0;
              local_8958 = psVar21;
              local_8918 = psVar21;
              do {
                if (uVar31 < uVar9) {
                  if (ri->bits_per_channel == 0x10) {
                    if (0 < iVar16) {
                      lVar25 = 0;
                      do {
                        iVar33 = stbi__get16be(s);
                        local_8958[lVar25 * 4] = (stbi__uint16)iVar33;
                        lVar25 = lVar25 + 1;
                      } while (iVar29 != (int)lVar25);
                    }
                  }
                  else if (iVar14 == 0x10) {
                    if (0 < iVar16) {
                      lVar25 = 0;
                      do {
                        iVar33 = stbi__get16be(s);
                        *(char *)(local_8918 + lVar25 * 2) = (char)((uint)iVar33 >> 8);
                        lVar25 = lVar25 + 1;
                      } while (iVar29 != (int)lVar25);
                    }
                  }
                  else if (0 < iVar16) {
                    lVar25 = 0;
                    do {
                      psVar22 = s->img_buffer;
                      if (psVar22 < s->img_buffer_end) {
LAB_00110958:
                        s->img_buffer = psVar22 + 1;
                        sVar5 = *psVar22;
                      }
                      else {
                        if (s->read_from_callbacks != 0) {
                          stbi__refill_buffer(s);
                          psVar22 = s->img_buffer;
                          goto LAB_00110958;
                        }
                        sVar5 = '\0';
                      }
                      *(stbi_uc *)(local_8918 + lVar25 * 2) = sVar5;
                      lVar25 = lVar25 + 1;
                    } while (iVar29 != (int)lVar25);
                  }
                }
                else if (iVar14 == 0x10 && bpc == 0x10) {
                  if (0 < iVar16) {
                    lVar25 = 0;
                    do {
                      local_8958[lVar25 * 4] = -(ushort)(uVar31 == 3);
                      lVar25 = lVar25 + 1;
                    } while (iVar29 != (int)lVar25);
                  }
                }
                else if (0 < iVar16) {
                  lVar25 = 0;
                  do {
                    *(char *)(local_8918 + lVar25 * 2) = -(uVar31 == 3);
                    lVar25 = lVar25 + 1;
                  } while (iVar29 != (int)lVar25);
                }
                uVar31 = uVar31 + 1;
                local_8918 = (stbi__uint16 *)((long)local_8918 + 1);
                local_8958 = local_8958 + 1;
              } while (uVar31 != 4);
            }
            else {
              stbi__skip(s,uVar9 * uVar13 * 2);
              uVar31 = 0;
              psVar28 = psVar21;
              do {
                if (uVar31 < uVar9) {
                  iVar14 = stbi__psd_decode_rle(s,(stbi_uc *)((long)psVar21 + uVar31),iVar16);
                  if (iVar14 == 0) {
                    free(psVar21);
                    pcVar19 = "corrupt";
                    goto LAB_0010f3f6;
                  }
                }
                else if (0 < iVar16) {
                  lVar25 = 0;
                  do {
                    *(char *)(psVar28 + lVar25 * 2) = -(uVar31 == 3);
                    lVar25 = lVar25 + 1;
                  } while ((iVar10 + iVar8) * (iVar15 + iVar12) != (int)lVar25);
                }
                uVar31 = uVar31 + 1;
                psVar28 = (stbi__uint16 *)((long)psVar28 + 1);
              } while (uVar31 != 4);
            }
            if (3 < uVar9) {
              if (ri->bits_per_channel == 0x10) {
                if (0 < iVar16) {
                  uVar31 = 0;
                  do {
                    uVar1 = psVar21[uVar31 * 4 + 3];
                    if ((uVar1 != 0) && (uVar1 != 0xffff)) {
                      fVar37 = 1.0 / ((float)uVar1 / 65535.0);
                      fVar36 = (1.0 - fVar37) * 65535.0;
                      psVar21[uVar31 * 4] =
                           (stbi__uint16)(int)((float)psVar21[uVar31 * 4] * fVar37 + fVar36);
                      psVar21[uVar31 * 4 + 1] =
                           (stbi__uint16)(int)((float)psVar21[uVar31 * 4 + 1] * fVar37 + fVar36);
                      psVar21[uVar31 * 4 + 2] =
                           (stbi__uint16)(int)((float)psVar21[uVar31 * 4 + 2] * fVar37 + fVar36);
                    }
                    uVar31 = uVar31 + 1;
                  } while ((uint)((iVar10 + iVar8) * (iVar15 + iVar12)) != uVar31);
                }
              }
              else if (0 < iVar16) {
                uVar31 = 0;
                do {
                  bVar6 = *(byte *)((long)psVar21 + uVar31 * 4 + 3);
                  if ((bVar6 != 0) && (bVar6 != 0xff)) {
                    fVar37 = 1.0 / ((float)bVar6 / 255.0);
                    fVar36 = (1.0 - fVar37) * 255.0;
                    *(char *)(psVar21 + uVar31 * 2) =
                         (char)(int)((float)(byte)psVar21[uVar31 * 2] * fVar37 + fVar36);
                    *(char *)((long)psVar21 + uVar31 * 4 + 1) =
                         (char)(int)((float)*(byte *)((long)psVar21 + uVar31 * 4 + 1) * fVar37 +
                                    fVar36);
                    *(char *)(psVar21 + uVar31 * 2 + 1) =
                         (char)(int)((float)(byte)psVar21[uVar31 * 2 + 1] * fVar37 + fVar36);
                  }
                  uVar31 = uVar31 + 1;
                } while ((uint)((iVar10 + iVar8) * (iVar15 + iVar12)) != uVar31);
              }
            }
            if ((req_comp & 0xfffffffbU) != 0) {
              if (ri->bits_per_channel == 0x10) {
                psVar21 = stbi__convert_format16(psVar21,4,req_comp,uVar26,uVar13);
              }
              else {
                psVar21 = (stbi__uint16 *)
                          stbi__convert_format((uchar *)psVar21,4,req_comp,uVar26,uVar13);
              }
              if (psVar21 == (stbi__uint16 *)0x0) {
                return (void *)0x0;
              }
            }
            if (comp != (int *)0x0) {
              *comp = 4;
            }
            *y = uVar13;
            *x = uVar26;
            return psVar21;
          }
          goto LAB_0011080c;
        }
      }
    }
  }
LAB_0011000e:
  pcVar19 = "too large";
LAB_0010f3f6:
  *(char **)(in_FS_OFFSET + -0x20) = pcVar19;
  return (void *)0x0;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   // test the formats with a very explicit header first (at least a FOURCC
   // or distinctive magic number first)
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif

   // then the formats that can end up attempting to load with just 1 or 2
   // bytes matching expectations; these are prone to false positives, so
   // try them later
   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}